

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<args::Command_*,_std::allocator<args::Command_*>_> * __thiscall
args::Command::GetCommands
          (vector<args::Command_*,_std::allocator<args::Command_*>_> *__return_storage_ptr__,
          Command *this)

{
  int iVar1;
  initializer_list<args::Command_*> __l;
  allocator_type local_19;
  Command *local_18;
  
  if (this->selectedCommand == (Command *)0x0) {
    iVar1 = (*(this->super_Group).super_Base._vptr_Base[2])(this);
    if ((char)iVar1 == '\0') {
      __l._M_len = 1;
      __l._M_array = &local_18;
      local_18 = this;
      std::vector<args::Command_*,_std::allocator<args::Command_*>_>::vector
                (__return_storage_ptr__,__l,&local_19);
    }
    else {
      Group::GetCommands(__return_storage_ptr__,&this->super_Group);
    }
  }
  else {
    (*(this->selectedCommand->super_Group).super_Base._vptr_Base[5])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Command*> GetCommands() override
            {
                if (selectedCommand != nullptr)
                {
                    return selectedCommand->GetCommands();
                }

                if (Matched())
                {
                    return Group::GetCommands();
                }

                return { this };
            }